

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O3

Ptr __thiscall r_comp::RepliMacro::expandMacro(RepliMacro *this,RepliStruct *oldStruct)

{
  long *plVar1;
  undefined4 *puVar2;
  string *psVar3;
  _Alloc_hider this_00;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type *psVar8;
  long lVar9;
  __fn *in_RDX;
  void *__child_stack;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  long lVar11;
  void *in_R8;
  RepliStruct *__tmp;
  _Alloc_hider this_01;
  Ptr PVar12;
  string *local_140;
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  _Alloc_hider local_d8;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  
  if (*(long *)((long)&(oldStruct->cmd).field_2 + 8) == 0) {
    std::operator+(&local_118,"Macro \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oldStruct);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
    local_140 = (string *)&local_130;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar8) {
      local_130 = *psVar8;
      aStack_128._M_allocated_capacity = plVar5[3];
    }
    else {
      local_130 = *psVar8;
      local_140 = (string *)*plVar5;
    }
    local_138._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((oldStruct->tail).field_2._M_local_buf + 8,(ulong)local_140);
    _Var10._M_pi = extraout_RDX;
LAB_00120dc0:
    if (local_140 != (string *)&local_130) {
      operator_delete(local_140);
      _Var10._M_pi = extraout_RDX_06;
    }
    paVar7 = &local_118.field_2;
  }
  else {
    if ((oldStruct->tail)._M_string_length == 0) {
      std::operator+(&local_118,"Macro \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oldStruct)
      ;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
      local_140 = (string *)&local_130;
      psVar8 = puVar6 + 2;
      if ((size_type *)*puVar6 == psVar8) {
        local_130 = *psVar8;
        aStack_128._M_allocated_capacity = puVar6[3];
      }
      else {
        local_130 = *psVar8;
        local_140 = (string *)*puVar6;
      }
      local_138._M_p = (pointer)puVar6[1];
      *puVar6 = psVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::_M_append((oldStruct->tail).field_2._M_local_buf + 8,(ulong)local_140);
      _Var10._M_pi = extraout_RDX_00;
      goto LAB_00120dc0;
    }
    if (in_RDX == (__fn *)0x0) {
      std::operator+(&local_118,"Macro \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oldStruct)
      ;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
      local_140 = (string *)&local_130;
      psVar8 = puVar6 + 2;
      if ((size_type *)*puVar6 == psVar8) {
        local_130 = *psVar8;
        aStack_128._M_allocated_capacity = puVar6[3];
      }
      else {
        local_130 = *psVar8;
        local_140 = (string *)*puVar6;
      }
      local_138._M_p = (pointer)puVar6[1];
      *puVar6 = psVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::_M_append((oldStruct->tail).field_2._M_local_buf + 8,(ulong)local_140);
      _Var10._M_pi = extraout_RDX_05;
      goto LAB_00120dc0;
    }
    iVar4 = std::__cxx11::string::compare((string *)(in_RDX + 8));
    if (iVar4 == 0) {
      lVar9 = *(long *)((long)&(oldStruct->cmd).field_2 + 8);
      plVar5 = (long *)(lVar9 + 0xb8);
      plVar1 = (long *)(lVar9 + 0xb0);
      if (*plVar5 == *plVar1) {
        (this->name)._M_dataplus._M_p = (pointer)0x0;
        (this->name)._M_string_length = 0;
        if (*(long *)(in_RDX + 0xb8) != *(long *)(in_RDX + 0xb0)) {
          RepliStruct::clone((RepliStruct *)&local_140,in_RDX,__child_stack,(int)lVar9,in_R8);
          (this->name)._M_dataplus._M_p = (pointer)local_140;
          (this->name)._M_string_length = (size_type)local_138._M_p;
          std::__cxx11::string::_M_assign((string *)&local_140->_M_string_length);
          std::__cxx11::string::_M_assign((string *)&local_140[2]._M_string_length);
          _Var10._M_pi = extraout_RDX_08;
          goto LAB_00120dea;
        }
      }
      else {
        lVar9 = *(long *)(in_RDX + 0xb8) - *(long *)(in_RDX + 0xb0);
        if (*plVar5 - *plVar1 != lVar9) {
          std::operator+(&local_50,"Macro \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         oldStruct);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 == paVar7) {
            local_c0._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_c0._8_8_ = plVar5[3];
            local_d0._0_8_ = &local_c0;
          }
          else {
            local_c0._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_d0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar5;
          }
          local_d0._8_8_ = plVar5[1];
          *plVar5 = (long)paVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          lVar9 = *(long *)((long)&(oldStruct->cmd).field_2 + 8);
          std::__cxx11::to_string(&local_70,*(long *)(lVar9 + 0xb8) - *(long *)(lVar9 + 0xb0) >> 4);
          std::operator+(&local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0,&local_70);
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
          psVar8 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_f8.field_2._M_allocated_capacity = *psVar8;
            local_f8.field_2._8_8_ = puVar6[3];
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          }
          else {
            local_f8.field_2._M_allocated_capacity = *psVar8;
            local_f8._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_f8._M_string_length = puVar6[1];
          *puVar6 = psVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          std::__cxx11::to_string
                    (&local_90,*(long *)(in_RDX + 0xb8) - *(long *)(in_RDX + 0xb0) >> 4);
          std::operator+(&local_118,&local_f8,&local_90);
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
          psVar8 = puVar6 + 2;
          if ((size_type *)*puVar6 == psVar8) {
            local_130 = *psVar8;
            aStack_128._M_allocated_capacity = puVar6[3];
            local_140 = (string *)&local_130;
          }
          else {
            local_130 = *psVar8;
            local_140 = (string *)*puVar6;
          }
          local_138._M_p = (pointer)puVar6[1];
          *puVar6 = psVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((oldStruct->tail).field_2._M_local_buf + 8,(ulong)local_140);
          _Var10._M_pi = extraout_RDX_13;
          if (local_140 != (string *)&local_130) {
            operator_delete(local_140);
            _Var10._M_pi = extraout_RDX_14;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
            _Var10._M_pi = extraout_RDX_15;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
            _Var10._M_pi = extraout_RDX_16;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
            _Var10._M_pi = extraout_RDX_17;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
            _Var10._M_pi = extraout_RDX_18;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
            _Var10._M_pi = extraout_RDX_19;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._0_8_ != &local_c0) {
            operator_delete((void *)local_d0._0_8_);
            _Var10._M_pi = extraout_RDX_20;
          }
          paVar7 = &local_50.field_2;
          goto LAB_00120dd4;
        }
        (this->name)._M_dataplus._M_p = (pointer)0x0;
        (this->name)._M_string_length = 0;
      }
      RepliStruct::clone((RepliStruct *)&local_140,(__fn *)(oldStruct->tail)._M_string_length,
                         __child_stack,(int)lVar9,in_R8);
      (this->name)._M_dataplus._M_p = (pointer)local_140;
      (this->name)._M_string_length = (size_type)local_138._M_p;
      local_d8._M_p = (pointer)local_140;
      std::__cxx11::string::_M_assign((string *)&local_140[2]._M_string_length);
      lVar9 = *(long *)((long)&(oldStruct->cmd).field_2 + 8);
      lVar11 = *(long *)(lVar9 + 0xb0);
      lVar9 = *(long *)(lVar9 + 0xb8);
      _Var10._M_pi = extraout_RDX_09;
      if (lVar11 != lVar9) {
        puVar6 = *(undefined8 **)(in_RDX + 0xb0);
        this_01._M_p = (pointer)(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        aStack_128._8_8_ = this;
        do {
          PVar12 = RepliStruct::findAtom((RepliStruct *)&local_140,(string *)local_d8._M_p);
          this_00._M_p = local_138._M_p;
          psVar3 = local_140;
          _Var10 = PVar12.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01._M_p !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01._M_p);
            _Var10._M_pi = extraout_RDX_10;
          }
          if (psVar3 != (string *)0x0) {
            puVar2 = (undefined4 *)*puVar6;
            *(undefined4 *)&(psVar3->_M_dataplus)._M_p = *puVar2;
            std::__cxx11::string::_M_assign((string *)&psVar3->_M_string_length);
            std::__cxx11::string::_M_assign((string *)&psVar3[1]._M_string_length);
            std::__cxx11::string::_M_assign((string *)&psVar3[2]._M_string_length);
            std::__cxx11::string::_M_assign((string *)&psVar3[3]._M_string_length);
            std::__cxx11::string::_M_assign((string *)&psVar3[4]._M_string_length);
            psVar3[5]._M_string_length = *(size_type *)(puVar2 + 0x2a);
            std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::operator=((vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                         *)&psVar3[5].field_2,
                        (vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                         *)(puVar2 + 0x2c));
            psVar3[6]._M_string_length = *(size_type *)(puVar2 + 0x32);
            _Var10._M_pi = extraout_RDX_11;
          }
          this = (RepliMacro *)aStack_128._8_8_;
          lVar11 = lVar11 + 0x10;
          puVar6 = puVar6 + 2;
          this_01._M_p = this_00._M_p;
        } while (lVar11 != lVar9);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_p);
          _Var10._M_pi = extraout_RDX_12;
        }
      }
      goto LAB_00120dea;
    }
    std::operator+(&local_b0,"Macro \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oldStruct);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_f8.field_2._M_allocated_capacity = *psVar8;
      local_f8.field_2._8_8_ = plVar5[3];
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar8;
      local_f8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,*(ulong *)(in_RDX + 8));
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_118.field_2._M_allocated_capacity = *psVar8;
      local_118.field_2._8_8_ = plVar5[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar8;
      local_118._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_118._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    psVar8 = puVar6 + 2;
    if ((size_type *)*puVar6 == psVar8) {
      local_130 = *psVar8;
      aStack_128._M_allocated_capacity = puVar6[3];
      local_140 = (string *)&local_130;
    }
    else {
      local_130 = *psVar8;
      local_140 = (string *)*puVar6;
    }
    local_138._M_p = (pointer)puVar6[1];
    *puVar6 = psVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((oldStruct->tail).field_2._M_local_buf + 8,(ulong)local_140);
    _Var10._M_pi = extraout_RDX_01;
    if (local_140 != (string *)&local_130) {
      operator_delete(local_140);
      _Var10._M_pi = extraout_RDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
      _Var10._M_pi = extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
      _Var10._M_pi = extraout_RDX_04;
    }
    paVar7 = &local_b0.field_2;
  }
LAB_00120dd4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar7->_M_allocated_capacity)[-2] != paVar7) {
    operator_delete((undefined1 *)(&paVar7->_M_allocated_capacity)[-2]);
    _Var10._M_pi = extraout_RDX_07;
  }
  (this->name)._M_dataplus._M_p = (pointer)0x0;
  (this->name)._M_string_length = 0;
LAB_00120dea:
  PVar12.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  PVar12.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar12.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

RepliStruct::Ptr RepliMacro::expandMacro(RepliStruct *oldStruct)
{
    if (src == nullptr) {
        error += "Macro '" + name + "' source not defined. ";
        return nullptr;
    }

    if (dest == nullptr) {
        error += "Macro '" + name + "' destination not defined. ";
        return nullptr;
    }

    if (oldStruct == nullptr) {
        error += "Macro '" + name + "' cannot expand empty structure. ";
        return nullptr;
    }

    if (oldStruct->cmd.compare(this->name) != 0) {
        error += "Macro '" + name + "' cannot expand structure with different name '" + oldStruct->cmd + "'. ";
        return nullptr;
    }

    if ((src->args.size() > 0) && (src->args.size() != oldStruct->args.size())) {
        error += "Macro '" + name + "' requires " + std::to_string(src->args.size()) + " arguments, cannot expand structure with " + std::to_string(oldStruct->args.size()) + " arguments. ";
        return nullptr;
    }

    RepliStruct::Ptr newStruct;

    // Special case of macros without args, just copy in the args from oldStruct
    if ((src->args.size() == 0) && (oldStruct->args.size() > 0)) {
        newStruct = oldStruct->clone();
        newStruct->cmd = dest->cmd;
        newStruct->label = oldStruct->label;
        return newStruct;
    } else {
        newStruct = dest->clone();
        newStruct->label = oldStruct->label;
    }

    RepliStruct::Ptr findStruct;
    std::vector<RepliStruct::Ptr>::const_iterator iOld(oldStruct->args.begin());

    for (std::vector<RepliStruct::Ptr>::const_iterator iSrc(src->args.begin()), iSrcEnd(src->args.end()); iSrc != iSrcEnd; ++iSrc, ++iOld) {
        // printf("looking for '%s'\n", (*iSrc)->cmd.c_str());
        // find the Atom inside newStruct with the name of iSrc->cmd
        findStruct = newStruct->findAtom((*iSrc)->cmd);

        if (findStruct != nullptr) {
            // overwrite data in findStruct with the matching one from old
            *findStruct = *(*iOld);
        }
    }

    return newStruct;
}